

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::BP5Writer::TwoLevelAggregationMetadata(BP5Writer *this,TimestepInfo *TSInfo)

{
  JSONProfiler *this_00;
  Comm *pCVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  element_type *peVar2;
  pointer puVar3;
  uint uVar4;
  BP5Writer *pBVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  unsigned_long *n;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar10;
  _Alloc_hider _Var11;
  undefined8 *puVar12;
  pointer pMVar13;
  uint64_t uVar14;
  uint uVar15;
  size_type *psVar16;
  ulong uVar17;
  size_type sVar18;
  unsigned_long source;
  uint uVar19;
  initializer_list<adios2::core::iovec> __l;
  initializer_list<adios2::core::iovec> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  vector<unsigned_long,_std::allocator<unsigned_long>_> DataSizes;
  string __str;
  vector<char,_std::allocator<char>_> RecvBuffer;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  UniqueMetaMetaBlocks;
  string meta1_gather_str;
  size_t LocalSize;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> AttributeBlocks;
  vector<unsigned_long,_std::allocator<unsigned_long>_> WriterDataPositions;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> Metadata;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_338;
  BP5Writer *local_318;
  string local_310;
  allocator_type local_2ec;
  allocator_type local_2eb;
  allocator_type local_2ea;
  allocator_type local_2e9;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  local_2e8;
  undefined1 local_2c8 [32];
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  local_2a8;
  string local_288;
  vector<char,_std::allocator<char>_> local_268;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> local_248;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_228;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *local_210;
  BP5Serializer *local_208;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> local_200;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  local_1e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1d0;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  local_1b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1a0;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  local_188;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &this->m_Profiler;
  local_318 = this;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ES_meta1","");
  profiling::JSONProfiler::Start(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_2e8.
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7 = (*((TSInfo->MetaEncodeBuffer).
             super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Buffer[2])();
  peVar2 = (TSInfo->AttributeEncodeBuffer).
           super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar3 = (pointer)((TSInfo->MetaEncodeBuffer).
                     super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->m_FixedSize;
  if (peVar2 == (element_type *)0x0) {
    local_248.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_248.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    iVar8 = (*peVar2->_vptr_Buffer[2])();
    local_248.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var_00,iVar8);
    local_248.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((TSInfo->AttributeEncodeBuffer).
                   super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  m_FixedSize;
  }
  std::
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ::vector(&local_188,&TSInfo->NewMetaMetaBlocks);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_228;
  local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar7);
  local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar3;
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::vector
            ((vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)&local_310,__l,
             &local_2e9);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_248;
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::vector
            ((vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)local_2c8,__l_00,
             &local_2ea);
  pBVar5 = local_318;
  local_200.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_318->m_ThisTimestepDataSize;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_200;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2a8,__l_01,&local_2eb);
  local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pBVar5->m_StartDataPos;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_268;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_338,__l_02,&local_2ec);
  local_208 = &pBVar5->m_BP5Serializer;
  adios2::format::BP5Serializer::CopyMetadataToContiguous
            ((vector<char,_std::allocator<char>_> *)&local_288,local_208,&local_188,
             (vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)&local_310,
             (vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)local_2c8,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2a8,&local_338);
  pMVar13 = local_2e8.
            super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_2e8.
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_288._M_dataplus._M_p;
  local_2e8.
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_288._M_string_length;
  local_2e8.
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_288.field_2._M_allocated_capacity;
  local_288._M_dataplus._M_p = (pointer)0x0;
  local_288._M_string_length = 0;
  local_288.field_2._M_allocated_capacity = 0;
  if (pMVar13 != (pointer)0x0) {
    operator_delete(pMVar13);
  }
  if (local_288._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((pointer)local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a8.
      super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.
                    super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if (local_310._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  local_210 = &local_2a8;
  if (local_188.
      super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  pCVar1 = &(pBVar5->m_AggregatorMetadata).super_MPIAggregator.m_Comm;
  uVar9 = helper::Comm::Size(pCVar1);
  uVar4 = -uVar9;
  if (0 < (int)uVar9) {
    uVar4 = uVar9;
  }
  uVar19 = 1;
  if (9 < uVar4) {
    uVar17 = (ulong)uVar4;
    uVar6 = 4;
    do {
      uVar19 = uVar6;
      uVar15 = (uint)uVar17;
      if (uVar15 < 100) {
        uVar19 = uVar19 - 2;
        goto LAB_00480c73;
      }
      if (uVar15 < 1000) {
        uVar19 = uVar19 - 1;
        goto LAB_00480c73;
      }
      if (uVar15 < 10000) goto LAB_00480c73;
      uVar17 = uVar17 / 10000;
      uVar6 = uVar19 + 4;
    } while (99999 < uVar15);
    uVar19 = uVar19 + 1;
  }
LAB_00480c73:
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_310,(char)uVar19 - (char)((int)uVar9 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_310._M_dataplus._M_p + (uVar9 >> 0x1f),uVar19,uVar4);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_310,0,(char *)0x0,0x756095);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  psVar16 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_288.field_2._M_allocated_capacity = *psVar16;
    local_288.field_2._8_8_ = plVar10[3];
  }
  else {
    local_288.field_2._M_allocated_capacity = *psVar16;
    local_288._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_288._M_string_length = plVar10[1];
  *plVar10 = (long)psVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  profiling::JSONProfiler::AddTimerWatch(this_00,&local_288,true);
  iVar7 = helper::Comm::Size(pCVar1);
  if (1 < iVar7) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_288._M_dataplus._M_p,
               local_288._M_dataplus._M_p + local_288._M_string_length);
    profiling::JSONProfiler::Start(this_00,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    source = (long)local_2e8.
                   super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_2e8.
                   super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    helper::Comm::GatherValues<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_310,pCVar1,source,0);
    local_2c8._0_8_ = (pointer)0x0;
    local_2c8._8_8_ = (pointer)0x0;
    local_2c8._16_8_ = (pointer)0x0;
    iVar7 = helper::Comm::Rank(pCVar1);
    if (iVar7 == 0) {
      sVar18 = 0;
      for (_Var11._M_p = local_310._M_dataplus._M_p;
          _Var11._M_p != (pointer)local_310._M_string_length; _Var11._M_p = _Var11._M_p + 8) {
        sVar18 = sVar18 + *(size_type *)_Var11._M_p;
      }
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)local_2c8,sVar18);
    }
    helper::Comm::GathervArrays<char>
              (pCVar1,(char *)local_2e8.
                              super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                              ._M_impl.super__Vector_impl_data._M_start,source,
               (size_t *)local_310._M_dataplus._M_p,
               (long)(local_310._M_string_length - (long)local_310._M_dataplus._M_p) >> 3,
               (char *)local_2c8._0_8_,0);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_288._M_dataplus._M_p,
               local_288._M_dataplus._M_p + local_288._M_string_length);
    profiling::JSONProfiler::Stop(this_00,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    iVar7 = helper::Comm::Rank(pCVar1);
    if (iVar7 == 0) {
      local_2a8.
      super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2a8.
      super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2a8.
      super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_248.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_248.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_248.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_1a0,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_310);
      adios2::format::BP5Serializer::BreakoutContiguousMetadata
                (&local_200,local_208,(vector<char,_std::allocator<char>_> *)local_2c8,&local_1a0,
                 &local_2a8,&local_248,&local_338,&local_228);
      if (local_1a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2e8.
          super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_2e8.
          super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_2e8.
        super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_2e8.
             super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      std::
      vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::vector(&local_1b8,&local_2a8);
      adios2::format::BP5Serializer::CopyMetadataToContiguous
                (&local_268,local_208,&local_1b8,&local_200,&local_248,&local_338,&local_228);
      pMVar13 = local_2e8.
                super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_2e8.
      super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_2e8.
      super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_2e8.
      super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (pMVar13 != (pointer)0x0) {
        operator_delete(pMVar13);
      }
      if ((pointer)local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1b8.
          super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b8.
                        super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_200.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_200.
                        super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_248.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.
                        super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2a8.
          super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2a8.
                        super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_2c8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_310._M_dataplus._M_p);
    }
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ES_meta1","");
  profiling::JSONProfiler::Stop(this_00,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"ES_meta2","");
  profiling::JSONProfiler::Start(this_00,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  iVar7 = helper::Comm::Rank(pCVar1);
  if (iVar7 == 0) {
    local_2a8.
    super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a8.
    super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a8.
    super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((long)local_2e8.
                               super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2e8.
                              super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    pCVar1 = &local_318->m_CommMetadataAggregators;
    uVar9 = helper::Comm::Size(pCVar1);
    uVar4 = -uVar9;
    if (0 < (int)uVar9) {
      uVar4 = uVar9;
    }
    uVar19 = 1;
    if (9 < uVar4) {
      uVar17 = (ulong)uVar4;
      uVar6 = 4;
      do {
        uVar19 = uVar6;
        uVar15 = (uint)uVar17;
        if (uVar15 < 100) {
          uVar19 = uVar19 - 2;
          goto LAB_004811db;
        }
        if (uVar15 < 1000) {
          uVar19 = uVar19 - 1;
          goto LAB_004811db;
        }
        if (uVar15 < 10000) goto LAB_004811db;
        uVar17 = uVar17 / 10000;
        uVar6 = uVar19 + 4;
      } while (99999 < uVar15);
      uVar19 = uVar19 + 1;
    }
LAB_004811db:
    local_2c8._0_8_ = (pointer)(local_2c8 + 0x10);
    std::__cxx11::string::_M_construct((ulong)local_2c8,(char)uVar19 - (char)((int)uVar9 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)(char **)local_2c8._0_8_ + (ulong)(uVar9 >> 0x1f)),uVar19,uVar4);
    puVar12 = (undefined8 *)std::__cxx11::string::replace((ulong)local_2c8,0,(char *)0x0,0x7560af);
    psVar16 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_310.field_2._M_allocated_capacity = *psVar16;
      local_310.field_2._8_8_ = puVar12[3];
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    }
    else {
      local_310.field_2._M_allocated_capacity = *psVar16;
      local_310._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_310._M_string_length = puVar12[1];
    *puVar12 = psVar16;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
      operator_delete((void *)local_2c8._0_8_);
    }
    profiling::JSONProfiler::AddTimerWatch(this_00,&local_310,true);
    iVar7 = helper::Comm::Size(pCVar1);
    if (iVar7 < 2) {
      if (local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_338,
                   (iterator)
                   local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_268);
      }
      else {
        *local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish =
             (unsigned_long)
             local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_210 = &local_2e8;
    }
    else {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_310._M_dataplus._M_p,
                 local_310._M_string_length + local_310._M_dataplus._M_p);
      profiling::JSONProfiler::Start(this_00,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      helper::Comm::GatherValues<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2c8,pCVar1,
                 (unsigned_long)
                 local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,0);
      puVar3 = local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_2c8._0_8_;
      local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_2c8._8_8_;
      local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_2c8._16_8_;
      local_2c8._0_8_ = (pointer)0x0;
      local_2c8._8_8_ = (pointer)0x0;
      local_2c8._16_8_ = (pointer)0x0;
      if ((pointer)puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2c8._0_8_);
      }
      iVar7 = helper::Comm::Rank(pCVar1);
      if (iVar7 == 0) {
        sVar18 = 0;
        for (pMVar13 = (pointer)local_338.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start;
            pMVar13 !=
            (pointer)local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            pMVar13 = (pointer)&pMVar13->MetaMetaInfoLen) {
          sVar18 = sVar18 + (long)pMVar13->MetaMetaInfo;
        }
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)&local_2a8,sVar18);
      }
      helper::Comm::GathervArrays<char>
                (pCVar1,(char *)local_2e8.
                                super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                 (size_t)local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                 local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 (long)local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3,
                 (char *)local_2a8.
                         super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                         ._M_impl.super__Vector_impl_data._M_start,0);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,local_310._M_dataplus._M_p,
                 local_310._M_string_length + local_310._M_dataplus._M_p);
      profiling::JSONProfiler::Stop(this_00,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
    }
    iVar7 = helper::Comm::Rank(pCVar1);
    if (iVar7 == 0) {
      local_2c8._0_8_ = (pointer)0x0;
      local_2c8._8_8_ = (pointer)0x0;
      local_2c8._16_8_ = (pointer)0x0;
      local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_248.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_248.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_248.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      this_01 = &local_318->m_WriterDataPos;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_01,0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1d0,&local_338);
      adios2::format::BP5Serializer::BreakoutContiguousMetadata
                (&local_200,local_208,(vector<char,_std::allocator<char>_> *)local_210,&local_1d0,
                 (vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                  *)local_2c8,&local_248,&local_228,this_01);
      if (local_1d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::vector(&local_1e8,
               (vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                *)local_2c8);
      WriteMetaMetadata(local_318,&local_1e8);
      if (local_1e8.
          super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.
                        super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      local_318->m_LatestMetaDataPos = local_318->m_MetaDataPos;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"ES_write_metadata","");
      profiling::JSONProfiler::Start(this_00,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      pBVar5 = local_318;
      uVar14 = WriteMetadata(local_318,&local_200,&local_248);
      pBVar5->m_LatestMetaDataSize = uVar14;
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"ES_write_metadata","");
      profiling::JSONProfiler::Stop(this_00,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if ((local_318->super_BP5Engine).m_Parameters.AsyncWrite == 0) {
        WriteMetadataFileIndex
                  (local_318,local_318->m_LatestMetaDataPos,local_318->m_LatestMetaDataSize);
      }
      if (local_200.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_200.
                        super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_248.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.
                        super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2c8._0_8_);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    if ((pointer)local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_338.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2a8.
        super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a8.
                      super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"ES_meta2","");
  profiling::JSONProfiler::Stop(this_00,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if (local_2e8.
      super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.
                    super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BP5Writer::TwoLevelAggregationMetadata(format::BP5Serializer::TimestepInfo TSInfo)
{
    /*
     * Two-step metadata aggregation
     */
    m_Profiler.Start("ES_meta1");
    std::vector<char> MetaBuffer;
    core::iovec m{TSInfo.MetaEncodeBuffer->Data(), TSInfo.MetaEncodeBuffer->m_FixedSize};
    core::iovec a{nullptr, 0};
    if (TSInfo.AttributeEncodeBuffer)
    {
        a = {TSInfo.AttributeEncodeBuffer->Data(), TSInfo.AttributeEncodeBuffer->m_FixedSize};
    }
    MetaBuffer = m_BP5Serializer.CopyMetadataToContiguous(
        TSInfo.NewMetaMetaBlocks, {m}, {a}, {m_ThisTimestepDataSize}, {m_StartDataPos});

    std::string meta1_gather_str =
        "ES_meta1_gather_" + std::to_string(m_AggregatorMetadata.m_Comm.Size());
    m_Profiler.AddTimerWatch(meta1_gather_str, true);

    if (m_AggregatorMetadata.m_Comm.Size() > 1)
    { // level 1
        m_Profiler.Start(meta1_gather_str);
        size_t LocalSize = MetaBuffer.size();
        std::vector<size_t> RecvCounts = m_AggregatorMetadata.m_Comm.GatherValues(LocalSize, 0);
        std::vector<char> RecvBuffer;
        if (m_AggregatorMetadata.m_Comm.Rank() == 0)
        {
            uint64_t TotalSize = 0;
            for (auto &n : RecvCounts)
                TotalSize += n;
            RecvBuffer.resize(TotalSize);
        }
        m_AggregatorMetadata.m_Comm.GathervArrays(MetaBuffer.data(), LocalSize, RecvCounts.data(),
                                                  RecvCounts.size(), RecvBuffer.data(), 0);
        m_Profiler.Stop(meta1_gather_str);
        if (m_AggregatorMetadata.m_Comm.Rank() == 0)
        {
            std::vector<format::BP5Base::MetaMetaInfoBlock> UniqueMetaMetaBlocks;
            std::vector<uint64_t> DataSizes;
            std::vector<uint64_t> WriterDataPositions;
            std::vector<core::iovec> AttributeBlocks;
            auto Metadata = m_BP5Serializer.BreakoutContiguousMetadata(
                RecvBuffer, RecvCounts, UniqueMetaMetaBlocks, AttributeBlocks, DataSizes,
                WriterDataPositions);

            MetaBuffer.clear();
            MetaBuffer = m_BP5Serializer.CopyMetadataToContiguous(
                UniqueMetaMetaBlocks, Metadata, AttributeBlocks, DataSizes, WriterDataPositions);
        }
    } // level 1
    m_Profiler.Stop("ES_meta1");
    m_Profiler.Start("ES_meta2");
    // level 2
    if (m_AggregatorMetadata.m_Comm.Rank() == 0)
    {
        std::vector<char> RecvBuffer;
        std::vector<char> *buf;
        std::vector<size_t> RecvCounts;
        size_t LocalSize = MetaBuffer.size();
        std::string meta2_gather_str =
            "ES_meta2_gather_" + std::to_string(m_CommMetadataAggregators.Size());
        m_Profiler.AddTimerWatch(meta2_gather_str, true);
        if (m_CommMetadataAggregators.Size() > 1)
        {
            m_Profiler.Start(meta2_gather_str);
            RecvCounts = m_CommMetadataAggregators.GatherValues(LocalSize, 0);
            if (m_CommMetadataAggregators.Rank() == 0)
            {
                uint64_t TotalSize = 0;
                for (auto &n : RecvCounts)
                    TotalSize += n;
                RecvBuffer.resize(TotalSize);
                /*std::cout << "MD Lvl-2: rank " << m_Comm.Rank() << " gather "
                          << TotalSize << " bytes from aggregator group"
                          << std::endl;*/
            }

            m_CommMetadataAggregators.GathervArrays(MetaBuffer.data(), LocalSize, RecvCounts.data(),
                                                    RecvCounts.size(), RecvBuffer.data(), 0);
            buf = &RecvBuffer;
            m_Profiler.Stop(meta2_gather_str);
        }
        else
        {
            buf = &MetaBuffer;
            RecvCounts.push_back(LocalSize);
        }

        if (m_CommMetadataAggregators.Rank() == 0)
        {
            std::vector<format::BP5Base::MetaMetaInfoBlock> UniqueMetaMetaBlocks;
            std::vector<uint64_t> DataSizes;
            std::vector<core::iovec> AttributeBlocks;
            m_WriterDataPos.resize(0);
            auto Metadata = m_BP5Serializer.BreakoutContiguousMetadata(
                *buf, RecvCounts, UniqueMetaMetaBlocks, AttributeBlocks, DataSizes,
                m_WriterDataPos);
            assert(m_WriterDataPos.size() == static_cast<size_t>(m_Comm.Size()));
            WriteMetaMetadata(UniqueMetaMetaBlocks);
            m_LatestMetaDataPos = m_MetaDataPos;
            m_Profiler.Start("ES_write_metadata");
            m_LatestMetaDataSize = WriteMetadata(Metadata, AttributeBlocks);
            m_Profiler.Stop("ES_write_metadata");
            if (!m_Parameters.AsyncWrite)
            {
                WriteMetadataFileIndex(m_LatestMetaDataPos, m_LatestMetaDataSize);
            }
        }
    } // level 2
    m_Profiler.Stop("ES_meta2");
}